

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O3

int __thiscall CTcSymObjBase::write_to_obj_file_main(CTcSymObjBase *this,CVmFile *fp)

{
  uint uVar1;
  uint16_t tmp;
  short sVar2;
  uint uVar3;
  byte bVar4;
  uint32_t tmp_1;
  CTcObjPropDel *pCVar5;
  char b_1 [4];
  char b [2];
  undefined4 local_4c;
  undefined4 local_48;
  byte local_44;
  byte local_43;
  byte local_42;
  undefined1 local_41;
  byte local_40;
  byte local_3f;
  byte local_3e;
  undefined2 local_3d;
  undefined2 local_3b;
  undefined2 local_39;
  
  uVar1 = G_prs->obj_file_sym_idx_;
  G_prs->obj_file_sym_idx_ = uVar1 + 1;
  this->obj_file_idx_ = uVar1;
  if (this->dict_ != (CTcDictEntry *)0x0) {
    CTcDictEntry::write_sym_to_obj_file(this->dict_,fp);
  }
  uVar3 = *(uint *)&this->field_0xb8;
  if ((uVar3 >> 9 & 1) == 0) {
    local_48 = CONCAT22(local_48._2_2_,
                        *(undefined2 *)
                         &(this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                          super_CVmHashEntry.field_0x24);
    CVmFile::write_bytes(fp,(char *)&local_48,2);
    CTcSymbolBase::write_name_to_file((CTcSymbolBase *)this,fp);
    uVar3 = (uint)*(ushort *)&this->field_0xb8;
  }
  local_48 = (undefined4)this->obj_id_;
  bVar4 = (byte)uVar3;
  local_44 = bVar4 & 1;
  local_43 = bVar4 >> 3 & 1;
  local_42 = bVar4 >> 4 & 1;
  local_41 = this->mod_base_sym_ != (CTcSymObj *)0x0;
  local_40 = bVar4 >> 2 & 1;
  if (this->obj_stm_ == (CTPNStmObject *)0x0) {
    local_3f = 0;
  }
  else {
    local_3f = (this->obj_stm_->super_CTPNStmObjectBase).super_CTPNObjDef.field_0x49 & 1;
  }
  local_3e = (byte)(uVar3 >> 0xb) & 1;
  local_3d = (undefined2)this->metaclass_;
  if (this->dict_ == (CTcDictEntry *)0x0) {
    local_3b = 0;
  }
  else {
    local_3b = (undefined2)this->dict_->obj_idx_;
  }
  local_39 = (undefined2)this->obj_file_idx_;
  CVmFile::write_bytes(fp,(char *)&local_48,0x11);
  if ((this->field_0xb8 & 1) == 0) {
    local_4c = (undefined4)this->stream_ofs_;
    CVmFile::write_bytes(fp,(char *)&local_4c,4);
  }
  if (this->mod_base_sym_ != (CTcSymObj *)0x0) {
    sVar2 = 0;
    for (pCVar5 = this->first_del_prop_; pCVar5 != (CTcObjPropDel *)0x0; pCVar5 = pCVar5->nxt_) {
      sVar2 = sVar2 + 1;
    }
    local_4c = CONCAT22(local_4c._2_2_,sVar2);
    CVmFile::write_bytes(fp,(char *)&local_4c,2);
    pCVar5 = this->first_del_prop_;
    if (pCVar5 != (CTcObjPropDel *)0x0) {
      do {
        local_4c = CONCAT22(local_4c._2_2_,
                            (short)(pCVar5->prop_sym_->super_CTcSymPropBase).super_CTcSymbol.
                                   super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.len_)
        ;
        CVmFile::write_bytes(fp,(char *)&local_4c,2);
        CVmFile::write_bytes
                  (fp,(pCVar5->prop_sym_->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                      super_CVmHashEntryCS.super_CVmHashEntry.str_,
                   (pCVar5->prop_sym_->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                   super_CVmHashEntryCS.super_CVmHashEntry.len_);
        pCVar5 = pCVar5->nxt_;
      } while (pCVar5 != (CTcObjPropDel *)0x0);
    }
  }
  CTcIdFixup::write_to_object_file(fp,this->fixups_);
  if (&this->mod_base_sym_->super_CTcSymObjBase != (CTcSymObjBase *)0x0) {
    write_to_obj_file_main(&this->mod_base_sym_->super_CTcSymObjBase,fp);
  }
  this->field_0xb8 = this->field_0xb8 | 0x40;
  return 1;
}

Assistant:

int CTcSymObjBase::write_to_obj_file_main(CVmFile *fp)
{
    /* take the next object file index */
    set_obj_file_idx(G_prs->get_next_obj_file_sym_idx());

    /* 
     *   if I have a dictionary object, make sure it's in the object file
     *   before I am - we need to be able to reference the object during
     *   load, so it has to be written before me 
     */
    if (dict_ != 0)
        dict_->write_sym_to_obj_file(fp);

    /* 
     *   if I'm not anonymous, write the basic header information for the
     *   symbol (don't do this for anonymous objects, since they don't have a
     *   name to write) 
     */
    if (!anon_)
        write_to_file_gen(fp);

    /* 
     *   write my object ID, so that we can translate from the local
     *   numbering system in the object file to the new numbering system in
     *   the image file 
     */
    char buf[32];
    oswp4(buf, obj_id_);

    /* write the flags */
    buf[4] = (is_extern_ != 0);
    buf[5] = (ext_replace_ != 0);
    buf[6] = (modified_ != 0);
    buf[7] = (mod_base_sym_ != 0);
    buf[8] = (ext_modify_ != 0);
    buf[9] = (obj_stm_ != 0 && obj_stm_->is_class());
    buf[10] = (transient_ != 0);

    /* add the metaclass type */
    oswp2(buf + 11, (int)metaclass_);

    /* add the dictionary's object file index, if we have one */
    if (dict_ != 0)
        oswp2(buf + 13, dict_->get_obj_idx());
    else
        oswp2(buf + 13, 0);

    /* 
     *   add my object file index (we store this to eliminate any dependency
     *   on the load order - this allows us to write other symbols
     *   recursively without worrying about exactly where the recursion
     *   occurs relative to assigning the file index) 
     */
    oswp2(buf + 15, get_obj_file_idx());

    /* write the data to the file */
    fp->write_bytes(buf, 17);

    /* if we're not external, write our stream address */
    if (!is_extern_)
        fp->write_uint4(stream_ofs_);

    /* if we're modifying another object, store some extra information */
    if (mod_base_sym_ != 0)
    {
        /* 
         *   Write our list of properties to be deleted from base objects at
         *   link time.  First, count the properties in the list.  
         */
        CTcObjPropDel *delprop;
        int cnt;
        for (cnt = 0, delprop = first_del_prop_ ; delprop != 0 ;
             ++cnt, delprop = delprop->nxt_) ;

        /* write the count */
        fp->write_uint2(cnt);

        /* write the deleted property list */
        for (delprop = first_del_prop_ ; delprop != 0 ;
             delprop = delprop->nxt_)
        {
            /* 
             *   write out this property symbol (we write the symbol rather
             *   than the ID, because when we load the object file, we'll
             *   need to adjust the ID to new global numbering system in the
             *   image file; the easiest way to do this is to write the
             *   symbol and look it up at load time) 
             */
            fp->write_uint2(delprop->prop_sym_->get_sym_len());
            fp->write_bytes(delprop->prop_sym_->get_sym(),
                            delprop->prop_sym_->get_sym_len());
        }
    }

    /* write our self-reference fixup list */
    CTcIdFixup::write_to_object_file(fp, fixups_);

    /*
     *   If this is a modifying object, we must write the entire chain of
     *   modified base objects immediately after this object.  When we're
     *   reading the symbol table, this ensures that we can read each
     *   modified base object recursively as we read its modifiers, which is
     *   necessary so that we can build up the same modification chain on
     *   loading the object file.  
     */
    if (mod_base_sym_ != 0)
    {
        /* write the main part of the definition */
        mod_base_sym_->write_to_obj_file_main(fp);
    }

    /* mark the object as written to the file */
    written_to_obj_ = TRUE;

    /* written */
    return TRUE;
}